

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
* __thiscall
diligent_spirv_cross::Compiler::get_active_interface_variables
          (unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
           *__return_storage_ptr__,Compiler *this)

{
  uint id;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  ExecutionModel EVar4;
  SPIRFunction *func;
  SPIRVariable *pSVar5;
  long lVar6;
  InterfaceVariableAccessHandler handler;
  LoopLock local_58;
  value_type local_4c;
  OpcodeHandler local_48;
  Compiler *local_40;
  unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
  *local_38;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_48._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_00899830;
  local_40 = this;
  local_38 = __return_storage_ptr__;
  func = get<diligent_spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_48);
  ParsedIR::create_loop_hard_lock(&this->ir);
  pTVar1 = (this->ir).ids_for_type[2].
           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->ir).ids_for_type[2].
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
          buffer_size;
  lVar6 = 0;
  do {
    if (sVar2 << 2 == lVar6) {
      ParsedIR::LoopLock::~LoopLock(&local_58);
      local_58.lock._0_4_ = this->dummy_sampler_id;
      if ((uint32_t)local_58.lock != 0) {
        ::std::__detail::
        _Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
        ::insert((_Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                  *)__return_storage_ptr__,(value_type *)&local_58);
      }
      return __return_storage_ptr__;
    }
    id = *(uint *)((long)&pTVar1->id + lVar6);
    if ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr[id].type == TypeVariable)
    {
      pSVar5 = ParsedIR::get<diligent_spirv_cross::SPIRVariable>(&this->ir,id);
      if (pSVar5->storage == Output) {
        bVar3 = interface_variable_exists_in_entry_point(this,(pSVar5->super_IVariant).self.id);
        if (bVar3) {
          if ((pSVar5->initializer).id == 0) {
            EVar4 = get_execution_model(this);
            if (EVar4 == ExecutionModelFragment) goto LAB_002c4d6e;
          }
          local_4c.id = (pSVar5->super_IVariant).self.id;
          ::std::__detail::
          _Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)__return_storage_ptr__,&local_4c);
        }
      }
    }
LAB_002c4d6e:
    lVar6 = lVar6 + 4;
  } while( true );
}

Assistant:

unordered_set<VariableID> Compiler::get_active_interface_variables() const
{
	// Traverse the call graph and find all interface variables which are in use.
	unordered_set<VariableID> variables;
	InterfaceVariableAccessHandler handler(*this, variables);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (var.storage != StorageClassOutput)
			return;
		if (!interface_variable_exists_in_entry_point(var.self))
			return;

		// An output variable which is just declared (but uninitialized) might be read by subsequent stages
		// so we should force-enable these outputs,
		// since compilation will fail if a subsequent stage attempts to read from the variable in question.
		// Also, make sure we preserve output variables which are only initialized, but never accessed by any code.
		if (var.initializer != ID(0) || get_execution_model() != ExecutionModelFragment)
			variables.insert(var.self);
	});

	// If we needed to create one, we'll need it.
	if (dummy_sampler_id)
		variables.insert(dummy_sampler_id);

	return variables;
}